

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O0

int64_t Imf_3_3::istream_threadsafe_read
                  (exr_const_context_t ctxt,void *userdata,void *buffer,uint64_t sz,uint64_t offset,
                  exr_stream_error_func_ptr_t error_cb)

{
  int64_t iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 in_R8;
  exception *e;
  int64_t nread;
  IStream *s;
  istream_holder *ih;
  
  iVar1 = (**(code **)(**(long **)(in_RSI + 0x28) + 0x50))
                    (*(long **)(in_RSI + 0x28),in_RDX,in_RCX,in_R8);
  return iVar1;
}

Assistant:

static int64_t
istream_threadsafe_read (
    exr_const_context_t         ctxt,
    void*                       userdata,
    void*                       buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    istream_holder* ih    = static_cast<istream_holder*> (userdata);
    IStream*        s     = ih->_stream;
    int64_t         nread = -1;

    try
    {
        nread = s->read (buffer, sz, offset);
    }
    catch (std::exception &e)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to seek to desired offset %" PRIu64 ": %s",
            offset,
            e.what());
        nread = -1;
    }
    catch (...)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to seek to desired offset %" PRIu64 ": Unknown error",
            offset);
        nread = -1;
    }
    return nread;
}